

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extradata.cpp
# Opt level: O0

UBool __thiscall icu_63::ExtraData::setNoNoDelta(ExtraData *this,UChar32 c,Norm *norm)

{
  int iVar1;
  Norm *pNVar2;
  int32_t delta;
  Norm *norm_local;
  UChar32 c_local;
  ExtraData *this_local;
  
  if (((norm->mappingCP < 0) ||
      (((c < 0x80 && (0x7f < norm->mappingCP)) ||
       (pNVar2 = Norms::getNormRef((this->super_Enumerator).norms,norm->mappingCP),
       4 < (int)pNVar2->type)))) || ((iVar1 = norm->mappingCP - c, iVar1 < -0x40 || (0x40 < iVar1)))
     ) {
    this_local._7_1_ = '\0';
  }
  else {
    norm->type = NO_NO_DELTA;
    norm->offset = iVar1;
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool ExtraData::setNoNoDelta(UChar32 c, Norm &norm) const {
    // Try a compact, algorithmic encoding to a single compYesAndZeroCC code point.
    // Do not map from ASCII to non-ASCII.
    if(norm.mappingCP>=0 &&
            !(c<=0x7f && norm.mappingCP>0x7f) &&
            norms.getNormRef(norm.mappingCP).type<Norm::NO_NO_COMP_YES) {
        int32_t delta=norm.mappingCP-c;
        if(-Normalizer2Impl::MAX_DELTA<=delta && delta<=Normalizer2Impl::MAX_DELTA) {
            norm.type=Norm::NO_NO_DELTA;
            norm.offset=delta;
            return TRUE;
        }
    }
    return FALSE;
}